

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec.h
# Opt level: O3

void __thiscall vec<WellFounded>::growTo(vec<WellFounded> *this,uint size)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  
  if (this->sz < size) {
    reserve(this,size);
    uVar1 = this->sz;
    if (uVar1 < size) {
      lVar3 = (ulong)uVar1 * 0x230;
      iVar2 = size - uVar1;
      do {
        WellFounded::WellFounded
                  ((WellFounded *)((long)&(this->data->super_Propagator)._vptr_Propagator + lVar3));
        lVar3 = lVar3 + 0x230;
        iVar2 = iVar2 + -1;
      } while (iVar2 != 0);
    }
    this->sz = size;
  }
  return;
}

Assistant:

void growTo(unsigned int size) {
		if (size <= sz) {
			return;
		}
		reserve(size);
		for (unsigned int i = sz; i < size; i++) {
			new (&data[i]) T();
		}
		sz = size;
	}